

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

string * __thiscall
FIX::CharConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,CharConvertor *this,char value)

{
  char __c;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  char local_11;
  string *psStack_10;
  char value_local;
  
  __c = (char)this;
  local_11 = __c;
  psStack_10 = __return_storage_ptr__;
  if (__c == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_12);
    std::allocator<char>::~allocator(&local_12);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,1,__c,local_25);
    std::allocator<char>::~allocator(local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( char value )
  {
    if( value == '\0' ) return "";
    return std::string( 1, value );
  }